

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O1

void __thiscall Assimp::EmbedTexturesProcess::~EmbedTexturesProcess(EmbedTexturesProcess *this)

{
  ~EmbedTexturesProcess(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

EmbedTexturesProcess::~EmbedTexturesProcess() {
}